

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_by_name.hpp
# Opt level: O3

vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> * __thiscall
duckdb::UnionByName::UnionCols<duckdb::ParquetMultiFileInfo,duckdb::ParquetOptions>
          (vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> *__return_storage_ptr__,
          UnionByName *this,ClientContext *context,vector<duckdb::OpenFileInfo,_true> *files,
          vector<duckdb::LogicalType,_true> *union_col_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *union_col_names,ParquetOptions *options,MultiFileOptions *file_options)

{
  _Head_base<0UL,_duckdb::QueueProducerToken_*,_false> _Var1;
  const_reference pvVar2;
  BaseExecutorTask *this_00;
  BaseUnionData *pBVar3;
  BaseUnionData *pBVar4;
  shared_ptr<duckdb::BaseUnionData,_true> *reader;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__n;
  TaskScheduler *this_01;
  pointer *__ptr;
  case_insensitive_map_t<idx_t> union_names_map;
  TaskExecutor executor;
  _Head_base<0UL,_duckdb::Task_*,_false> local_108;
  ProducerToken *local_100;
  vector<duckdb::LogicalType,_true> *local_f8;
  vector<duckdb::LogicalType,_true> *local_f0;
  UnionByName *local_e8;
  TaskExecutor *local_e0;
  case_insensitive_map_t<idx_t> local_d8;
  TaskExecutor local_a0;
  
  (__return_storage_ptr__->
  super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ).
  super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ).
  super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ).
  super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = (ProducerToken *)__return_storage_ptr__;
  local_f8 = (vector<duckdb::LogicalType,_true> *)files;
  local_f0 = union_col_types;
  local_e0 = (TaskExecutor *)union_col_names;
  ::std::
  vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ::resize(&__return_storage_ptr__->
            super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
           ,((long)(context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                   internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi -
             (long)(context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                   internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr >> 4) * -0x5555555555555555);
  local_e8 = this;
  TaskExecutor::TaskExecutor(&local_a0,(ClientContext *)this);
  if ((element_type *)
      (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    __n = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      pvVar2 = vector<duckdb::OpenFileInfo,_true>::operator[]
                         ((vector<duckdb::OpenFileInfo,_true> *)context,(size_type)__n);
      this_00 = (BaseExecutorTask *)operator_new(0x58);
      BaseExecutorTask::BaseExecutorTask(this_00,&local_a0);
      (this_00->super_Task)._vptr_Task = (_func_int **)&PTR__Task_019a4a88;
      this_00[1].super_Task._vptr_Task = (_func_int **)local_e8;
      this_00[1].super_Task.super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
      super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pvVar2;
      this_00[1].super_Task.super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
      super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = __n;
      this_00[1].super_Task.token.ptr = local_100;
      this_00[1].executor = local_e0;
      this_00[2].super_Task._vptr_Task = (_func_int **)options;
      local_108._M_head_impl = (Task *)this_00;
      TaskExecutor::ScheduleTask
                (&local_a0,
                 (unique_ptr<duckdb::Task,_std::default_delete<duckdb::Task>,_true> *)&local_108);
      if ((BaseExecutorTask *)local_108._M_head_impl != (BaseExecutorTask *)0x0) {
        (*((Task *)&(local_108._M_head_impl)->_vptr_Task)->_vptr_Task[1])();
      }
      local_108._M_head_impl = (Task *)0x0;
      __n = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&__n->_vptr__Sp_counted_base + 1)
      ;
    } while (__n < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (((long)(context->super_enable_shared_from_this<duckdb::ClientContext>).
                           __weak_this_.internal.
                           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi -
                     (long)(context->super_enable_shared_from_this<duckdb::ClientContext>).
                           __weak_this_.internal.
                           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr >> 4) * -0x5555555555555555));
  }
  TaskExecutor::WorkOnTasks(&local_a0);
  local_d8._M_h._M_buckets = &local_d8._M_h._M_single_bucket;
  local_d8._M_h._M_bucket_count = 1;
  local_d8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_h._M_element_count = 0;
  local_d8._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8._M_h._M_rehash_policy._M_next_resize = 0;
  local_d8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_01 = local_100->scheduler;
  _Var1._M_head_impl =
       (local_100->token).
       super_unique_ptr<duckdb::QueueProducerToken,_std::default_delete<duckdb::QueueProducerToken>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::QueueProducerToken,_std::default_delete<duckdb::QueueProducerToken>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::QueueProducerToken_*,_std::default_delete<duckdb::QueueProducerToken>_>
       .super__Head_base<0UL,_duckdb::QueueProducerToken_*,_false>._M_head_impl;
  if (this_01 != (TaskScheduler *)_Var1._M_head_impl) {
    do {
      pBVar3 = shared_ptr<duckdb::BaseUnionData,_true>::operator->
                         ((shared_ptr<duckdb::BaseUnionData,_true> *)this_01);
      pBVar4 = shared_ptr<duckdb::BaseUnionData,_true>::operator->
                         ((shared_ptr<duckdb::BaseUnionData,_true> *)this_01);
      CombineUnionTypes(&pBVar3->names,&pBVar4->types,local_f8,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)local_f0,&local_d8);
      this_01 = (TaskScheduler *)&this_01->thread_lock;
    } while (this_01 != (TaskScheduler *)_Var1._M_head_impl);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_d8);
  TaskExecutor::~TaskExecutor(&local_a0);
  return (vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> *)local_100;
}

Assistant:

static vector<shared_ptr<BaseUnionData>>
	UnionCols(ClientContext &context, const vector<OpenFileInfo> &files, vector<LogicalType> &union_col_types,
	          vector<string> &union_col_names, OPTIONS_TYPE &options, MultiFileOptions &file_options) {
		vector<shared_ptr<BaseUnionData>> union_readers;
		union_readers.resize(files.size());

		TaskExecutor executor(context);
		// schedule tasks for all files
		for (idx_t file_idx = 0; file_idx < files.size(); ++file_idx) {
			auto task = make_uniq<UnionByReaderTask<OP, OPTIONS_TYPE>>(executor, context, files[file_idx], file_idx,
			                                                           union_readers, options, file_options);
			executor.ScheduleTask(std::move(task));
		}
		// complete all tasks
		executor.WorkOnTasks();

		// now combine the result schemas
		case_insensitive_map_t<idx_t> union_names_map;
		for (auto &reader : union_readers) {
			auto &col_names = reader->names;
			auto &sql_types = reader->types;
			CombineUnionTypes(col_names, sql_types, union_col_types, union_col_names, union_names_map);
		}
		return union_readers;
	}